

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

bool __thiscall
dap::BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_>::serialize
          (BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_> *this,
          Serializer *s,void *ptr)

{
  bool bVar1;
  
  bVar1 = Serializer::serialize<dap::Variable>(s,(array<dap::Variable> *)ptr);
  return bVar1;
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }